

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

void __thiscall
amrex::AmrLevel::setPhysBoundaryValues
          (AmrLevel *this,FArrayBox *dest,int state_indx,Real time,int dest_comp,int src_comp,
          int num_comp)

{
  char cVar1;
  StateData *this_00;
  
  cVar1 = (**(code **)(*(long *)**(undefined8 **)
                                  &(((this->state).
                                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                     .
                                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                                     ._M_impl.super__Vector_impl_data._M_start[state_indx].desc)->
                                   bc_func).
                                   super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
                      + 0x38))();
  this_00 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
            super__Vector_impl_data._M_start + state_indx;
  if (cVar1 == '\0') {
    StateData::FillBoundary
              (this_00,dest,time,(this->geom).super_CoordSys.dx,&(this->geom).prob_domain,dest_comp,
               src_comp,num_comp);
  }
  else {
    StateData::FillBoundary
              (this_00,&(dest->super_BaseFab<double>).domain,dest,time,&this->geom,dest_comp,
               src_comp,num_comp);
  }
  return;
}

Assistant:

void
AmrLevel::setPhysBoundaryValues (FArrayBox& dest,
                                 int        state_indx,
                                 Real       time,
                                 int        dest_comp,
                                 int        src_comp,
                                 int        num_comp)
{
    // Call the Fab interface if available.
    if (state[state_indx].descriptor()->hasBndryFuncFab()) {
        state[state_indx].FillBoundary(dest.box(), dest, time, geom, dest_comp, src_comp, num_comp);
    }
    else {
        state[state_indx].FillBoundary(dest,time,geom.CellSize(),
                                       geom.ProbDomain(),dest_comp,src_comp,num_comp);
    }
}